

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

hts_idx_t * hts_idx_load(char *fn,int fmt)

{
  int iVar1;
  char *ext;
  undefined1 local_150 [8];
  stat stat_main;
  stat stat_idx;
  hts_idx_t *idx;
  char *fnidx;
  int fmt_local;
  char *fn_local;
  
  idx = (hts_idx_t *)hts_idx_getfn(fn,".csi");
  if (idx == (hts_idx_t *)0x0) {
    ext = ".tbi";
    if (fmt == 1) {
      ext = ".bai";
    }
    idx = (hts_idx_t *)hts_idx_getfn(fn,ext);
    fnidx._4_4_ = fmt;
  }
  else {
    fnidx._4_4_ = 0;
  }
  if (idx == (hts_idx_t *)0x0) {
    fn_local = (char *)0x0;
  }
  else {
    iVar1 = stat(fn,(stat *)local_150);
    if (((iVar1 == 0) &&
        (iVar1 = stat((char *)idx,(stat *)(stat_main.__glibc_reserved + 2)), iVar1 == 0)) &&
       (stat_idx.st_atim.tv_nsec < stat_main.st_atim.tv_nsec)) {
      fprintf(_stderr,"Warning: The index file is older than the data file: %s\n",idx);
    }
    fn_local = (char *)hts_idx_load_local((char *)idx,fnidx._4_4_);
    free(idx);
  }
  return (hts_idx_t *)fn_local;
}

Assistant:

hts_idx_t *hts_idx_load(const char *fn, int fmt)
{
    char *fnidx;
    hts_idx_t *idx;
    fnidx = hts_idx_getfn(fn, ".csi");
    if (fnidx) fmt = HTS_FMT_CSI;
    else fnidx = hts_idx_getfn(fn, fmt == HTS_FMT_BAI? ".bai" : ".tbi");
    if (fnidx == 0) return 0;

    // Check that the index file is up to date, the main file might have changed
    struct stat stat_idx,stat_main;
    if ( !stat(fn, &stat_main) && !stat(fnidx, &stat_idx) )
    {
        if ( stat_idx.st_mtime < stat_main.st_mtime )
            fprintf(stderr, "Warning: The index file is older than the data file: %s\n", fnidx);
    }
    idx = hts_idx_load_local(fnidx, fmt);
    free(fnidx);
    return idx;
}